

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DArray.hpp
# Opt level: O1

void __thiscall
Lib::DArray<Kernel::Term*>::initFromIterator<Lib::VirtualIterator<Kernel::Term*>>
          (DArray<Kernel::Term*> *this,VirtualIterator<Kernel::Term_*> *it,size_t count)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 *puVar2;
  size_t s;
  
  if (count == 0) {
    DArray<Kernel::Term_*>::ensure((DArray<Kernel::Term_*> *)this,0);
    iVar1 = (*it->_core->_vptr_IteratorCore[2])();
    if ((char)iVar1 != '\0') {
      s = 1;
      do {
        DArray<Kernel::Term_*>::expand((DArray<Kernel::Term_*> *)this,s);
        iVar1 = (*it->_core->_vptr_IteratorCore[3])();
        *(ulong *)(*(long *)(this + 0x10) + -8 + s * 8) = CONCAT44(extraout_var_00,iVar1);
        iVar1 = (*it->_core->_vptr_IteratorCore[2])();
        s = s + 1;
      } while ((char)iVar1 != '\0');
    }
  }
  else {
    DArray<Kernel::Term_*>::ensure((DArray<Kernel::Term_*> *)this,count);
    puVar2 = *(undefined8 **)(this + 0x10);
    while( true ) {
      iVar1 = (*it->_core->_vptr_IteratorCore[2])();
      if ((char)iVar1 == '\0') break;
      iVar1 = (*it->_core->_vptr_IteratorCore[3])();
      *puVar2 = CONCAT44(extraout_var,iVar1);
      puVar2 = puVar2 + 1;
    }
  }
  return;
}

Assistant:

void initFromIterator(It it, size_t count=0) {
    if(count) {
      ensure(count);
      C* ptr=_array;
      while(it.hasNext()) {
	*(ptr++)=it.next();
      }
    } else {
      ensure(0);
      count=0;
      while(it.hasNext()) {
	expand(++count);
	(*this)[count-1]=it.next();
      }
    }
  }